

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTests.cpp
# Opt level: O3

void __thiscall
deqp::gles31::Functional::anon_unknown_0::ResourceDefinition::ShaderSet::ShaderSet
          (ShaderSet *this,SharedPtr *enclosing,GLSLVersion version,deUint32 stagesPresentBits,
          deUint32 stagesReferencingBits)

{
  int *piVar1;
  deInt32 *pdVar2;
  deUint32 stageNdx;
  long lVar3;
  undefined4 in_register_00000014;
  uint in_R9D;
  
  (this->super_Node)._vptr_Node = (_func_int **)&PTR__Node_02160298;
  (this->super_Node).m_type = TYPE_SHADER_SET;
  (this->super_Node).m_enclosingNode.m_ptr = (Node *)enclosing;
  (this->super_Node).m_enclosingNode.m_state =
       (SharedPtrStateBase *)CONCAT44(in_register_00000014,version);
  if (CONCAT44(in_register_00000014,version) != 0) {
    LOCK();
    piVar1 = (int *)(CONCAT44(in_register_00000014,version) + 8);
    *piVar1 = *piVar1 + 1;
    UNLOCK();
    LOCK();
    pdVar2 = &((this->super_Node).m_enclosingNode.m_state)->weakRefCount;
    *pdVar2 = *pdVar2 + 1;
    UNLOCK();
  }
  (this->super_Node)._vptr_Node = (_func_int **)&PTR__Node_02160740;
  this->m_version = stagesPresentBits;
  lVar3 = 0;
  do {
    this->m_stagePresent[lVar3] = (stagesReferencingBits >> ((uint)lVar3 & 0x1f) & 1) != 0;
    this->m_stageReferencing[lVar3] = (in_R9D >> ((uint)lVar3 & 0x1f) & 1) != 0;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 6);
  return;
}

Assistant:

Node				(NodeType type, const SharedPtr& enclosingNode) : m_type(type), m_enclosingNode(enclosingNode) { DE_ASSERT(type < TYPE_LAST); }